

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

bool __thiscall
AmpIO::ReadCollectionStatus(AmpIO *this,bool *collecting,uchar *chan,unsigned_short *writeAddr)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  int iVar3;
  undefined8 in_RAX;
  quadlet_t read_data;
  uint local_24;
  
  local_24 = (uint)((ulong)in_RAX >> 0x20);
  uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if ((6 < uVar2) && (uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this), uVar2 != 0x44514c41)) {
    pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
    iVar3 = (*pBVar1->_vptr_BasePort[0x23])
                      (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,0x7800,&local_24);
    if ((char)iVar3 == '\0') {
      return false;
    }
    *collecting = (bool)((byte)(local_24 >> 0xf) & 1);
    *chan = (byte)(local_24 >> 10) & 0xf;
    *writeAddr = (ushort)local_24 & 0x3ff;
    return (bool)(char)iVar3;
  }
  return false;
}

Assistant:

bool AmpIO::ReadCollectionStatus(bool &collecting, unsigned char &chan, unsigned short &writeAddr) const
{
    if (GetFirmwareVersion() < 7) return false;
    if (GetHardwareVersion() == DQLA_String)
        return false;

    quadlet_t read_data;
    bool ret = port->ReadQuadlet(BoardId, 0x7800, read_data);
    if (ret) {
        collecting = (read_data&0x00008000);
        chan = (read_data&0x00003c00)>>10;
        writeAddr = (read_data&0x000003ff);
    }
    return ret;
}